

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerpool.c
# Opt level: O0

workerpool_t * workerpool_create(int nthreads)

{
  int iVar1;
  workerpool_t *__arg;
  zarray_t *pzVar2;
  pthread_t *ppVar3;
  int local_1c;
  int res;
  int i;
  workerpool_t *wp;
  int nthreads_local;
  
  if (nthreads < 1) {
    __assert_fail("nthreads > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/workerpool.c"
                  ,0x65,"workerpool_t *workerpool_create(int)");
  }
  __arg = (workerpool_t *)calloc(1,0xb8);
  __arg->nthreads = nthreads;
  pzVar2 = zarray_create(0x10);
  __arg->tasks = pzVar2;
  if (1 < nthreads) {
    ppVar3 = (pthread_t *)calloc((long)__arg->nthreads,8);
    __arg->threads = ppVar3;
    pthread_mutex_init((pthread_mutex_t *)&__arg->mutex,(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&__arg->startcond,(pthread_condattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&__arg->endcond,(pthread_condattr_t *)0x0);
    for (local_1c = 0; local_1c < nthreads; local_1c = local_1c + 1) {
      iVar1 = pthread_create(__arg->threads + local_1c,(pthread_attr_t *)0x0,worker_thread,__arg);
      if (iVar1 != 0) {
        perror("pthread_create");
        exit(-1);
      }
    }
  }
  return __arg;
}

Assistant:

workerpool_t *workerpool_create(int nthreads)
{
    assert(nthreads > 0);

    workerpool_t *wp = calloc(1, sizeof(workerpool_t));
    wp->nthreads = nthreads;
    wp->tasks = zarray_create(sizeof(struct task));

    if (nthreads > 1) {
        wp->threads = calloc(wp->nthreads, sizeof(pthread_t));

        pthread_mutex_init(&wp->mutex, NULL);
        pthread_cond_init(&wp->startcond, NULL);
        pthread_cond_init(&wp->endcond, NULL);

        for (int i = 0; i < nthreads; i++) {
            int res = pthread_create(&wp->threads[i], NULL, worker_thread, wp);
            if (res != 0) {
                perror("pthread_create");
                exit(-1);
            }
        }
    }

    return wp;
}